

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O0

MatrixXd * __thiscall CppMLNN::softmax(MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *z)

{
  double __x;
  non_const_type local_130;
  NestedExpressionType local_128;
  NestedExpressionType local_120;
  ExpressionTypeNested local_118;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>
  local_110;
  VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> local_e8;
  SumReturnType local_e0;
  undefined1 local_d0 [8];
  VectorXd sum_exp_z;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> local_b8 [16];
  undefined1 local_a8 [8];
  MatrixXd exp_z;
  ExpressionTypeNested local_78;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
  local_70;
  VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> local_48;
  EigenBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_maxCoeff<double>,_0>_>
  local_40 [16];
  undefined1 local_30 [8];
  VectorXd v_max;
  MatrixXd *z_local;
  CppMLNN *this_local;
  
  v_max.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = (Index)z;
  local_48.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z);
  Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::maxCoeff
            ((MaxCoeffReturnType *)local_40,&local_48);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_maxCoeff<double>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_30,local_40);
  local_78 = (ExpressionTypeNested)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z);
  exp_z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator-
            (&local_70,(VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_78,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             &exp_z.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)z,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>_>
              *)&local_70);
  sum_exp_z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::exp
            (local_b8,__x);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a8,
             (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_b8);
  local_e8.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a8);
  Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::sum(&local_e0,&local_e8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_d0,
             (EigenBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double>,_0>_>
              *)&local_e0);
  local_120 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a8);
  local_118.m_expression =
       (NestedExpressionType)
       Eigen::DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::rowwise
                 ((DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                  &local_120);
  local_130 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d0);
  local_128.m_matrix =
       (non_const_type)
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::array
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                  &local_130);
  Eigen::VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>>,1>::operator/
            (&local_110,
             (VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>,1> *)&local_118,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_128);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>,_1,1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_110);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

MatrixXd CppMLNN::softmax(MatrixXd z) {
	// minus max value of each output vector to avoid NaN
	// this is actually making softmax values to normalize between [0, 1]
	// and will not affect the results of softmax.
	VectorXd v_max = z.colwise().maxCoeff();
	z = z.rowwise() - v_max.transpose();

	MatrixXd exp_z = z.array().exp();
	VectorXd sum_exp_z = exp_z.colwise().sum();
	return static_cast<MatrixXd>(exp_z.array().rowwise() / sum_exp_z.transpose().array());
}